

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.cpp
# Opt level: O2

void __thiscall maths::Matrix::~Matrix(Matrix *this)

{
  double **ppdVar1;
  int i;
  long lVar2;
  
  for (lVar2 = 0; ppdVar1 = this->p, lVar2 < this->rows_; lVar2 = lVar2 + 1) {
    if (ppdVar1[lVar2] != (double *)0x0) {
      operator_delete__(ppdVar1[lVar2]);
    }
  }
  if (ppdVar1 != (double **)0x0) {
    operator_delete__(ppdVar1);
    return;
  }
  return;
}

Assistant:

Matrix::~Matrix()
{
    for (int i = 0; i < rows_; ++i) {
        delete[] p[i];
    }
    delete[] p;
}